

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O2

void __thiscall soinn::ESOINN::markAdjacentVertices(ESOINN *this,Vertex *vertex,int cID)

{
  long *plVar1;
  long *plVar2;
  Vertex v;
  Vertex local_38;
  
  plVar1 = (long *)*vertex;
  plVar2 = plVar1;
  while (plVar2 = (long *)*plVar2, plVar2 != plVar1) {
    local_38 = (Vertex)plVar2[2];
    if ((*(int *)((long)local_38 + 0x38) == -1) &&
       (*(double *)((long)local_38 + 0x40) <= *(double *)((long)*vertex + 0x40) &&
        *(double *)((long)*vertex + 0x40) != *(double *)((long)local_38 + 0x40))) {
      *(int *)((long)local_38 + 0x38) = cID;
      markAdjacentVertices(this,&local_38,cID);
    }
  }
  return;
}

Assistant:

void ESOINN::markAdjacentVertices(Vertex &vertex, int cID)
{
    AdjacencyIterator current, end;
    boost::tie(current, end) = boost::adjacent_vertices(vertex, graph);
    for(; current != end; current++){
        if(graph[*current].classId == -1 && graph[*current].density < graph[vertex].density)
        {
            graph[*current].classId = cID;
            Vertex v = *current;
            markAdjacentVertices(v, cID);
        }
    }
}